

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O0

void __thiscall IRBuilder::BuildEmpty(IRBuilder *this,OpCode newOpcode,uint32 offset)

{
  code *pcVar1;
  bool bVar2;
  RegSlot RVar3;
  uint uVar4;
  Instr *pIVar5;
  BranchInstr *pBVar6;
  uint *puVar7;
  LabelInstr *pLVar8;
  Type *pTVar9;
  bool *pbVar10;
  StackSym *pSVar11;
  undefined4 *puVar12;
  JITTimeFunctionBody *pJVar13;
  RegOpnd *pRVar14;
  IntConstOpnd *src1Opnd_00;
  RegOpnd *pRVar15;
  RegOpnd *src2Opnd;
  Instr *lfd;
  Opnd *localClosureOpnd;
  BranchInstr *brOnException;
  LabelInstr *labelInstr;
  BranchInstr *branchInstr_1;
  RegOpnd *regOpnd;
  BranchInstr *branchInstr;
  RegOpnd *funcExprOpnd;
  LabelInstr *labelNull;
  RegOpnd *src1Opnd;
  Instr *instr;
  uint32 offset_local;
  OpCode newOpcode_local;
  IRBuilder *this_local;
  
  Js::ByteCodeReader::Empty(&this->m_jnReader);
  pIVar5 = IR::Instr::New(newOpcode,this->m_func);
  if (newOpcode == Break) {
    bVar2 = Func::IsJitInDebugMode(this->m_func);
    if (!bVar2) {
      AddInstr(this,pIVar5,offset);
      return;
    }
    InsertBailOutForDebugger(this,offset,BailOutExplicit,(Instr *)0x0);
    return;
  }
  if (newOpcode == Ret) {
    pRVar14 = BuildDstOpnd(this,0,TyVar,false,false);
    IR::Instr::SetSrc1(pIVar5,&pRVar14->super_Opnd);
    AddInstr(this,pIVar5,offset);
    return;
  }
  if (newOpcode == CommitScope) {
    pJVar13 = Func::GetJITFunctionBody(this->m_func);
    RVar3 = JITTimeFunctionBody::GetLocalClosureReg(pJVar13);
    pRVar14 = BuildSrcOpnd(this,RVar3,TyVar);
    pLVar8 = IR::LabelInstr::New(Label,this->m_func,false);
    pRVar15 = IR::RegOpnd::New(TyVar,this->m_func);
    pIVar5 = IR::Instr::New(LdFuncExpr,&pRVar15->super_Opnd,this->m_func);
    AddInstr(this,pIVar5,offset);
    pBVar6 = IR::BranchInstr::New
                       (BrFncCachedScopeNeq,pLVar8,&pRVar15->super_Opnd,&pRVar14->super_Opnd,
                        this->m_func);
    AddInstr(this,&pBVar6->super_Instr,offset);
    pIVar5 = IR::Instr::New(CommitScope,this->m_func);
    IR::Instr::SetSrc1(pIVar5,&pRVar14->super_Opnd);
    AddInstr(this,pIVar5,offset);
    AddInstr(this,&pLVar8->super_Instr,0xffffffff);
    return;
  }
  if (newOpcode == LeaveNull) {
    this->finallyBlockLevel = this->finallyBlockLevel - 1;
    AddInstr(this,pIVar5,offset);
    return;
  }
  if (newOpcode == Leave) {
    if ((this->handlerOffsetStack !=
         (SList<JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>,_Memory::ArenaAllocator,_RealCount>
          *)0x0) &&
       (bVar2 = SListBase<JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>,_Memory::ArenaAllocator,_RealCount>
                ::Empty(&this->handlerOffsetStack->
                         super_SListBase<JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>,_Memory::ArenaAllocator,_RealCount>
                       ), !bVar2)) {
      pTVar9 = SList<JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>,_Memory::ArenaAllocator,_RealCount>
               ::Top(this->handlerOffsetStack);
      pbVar10 = JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>::Second(pTVar9);
      if ((*pbVar10 & 1U) != 0) {
        pBVar6 = IR::BranchInstr::New(BrOnException,(LabelInstr *)0x0,this->m_func);
        pTVar9 = SList<JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>,_Memory::ArenaAllocator,_RealCount>
                 ::Top(this->handlerOffsetStack);
        puVar7 = JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>::First(pTVar9);
        AddBranchInstr(this,pBVar6,offset,*puVar7);
      }
    }
    pLVar8 = IR::LabelInstr::New(Label,this->m_func,false);
    pBVar6 = IR::BranchInstr::New(Leave,pLVar8,this->m_func);
    AddInstr(this,&pBVar6->super_Instr,offset);
    AddInstr(this,&pLVar8->super_Instr,0xffffffff);
    return;
  }
  if (newOpcode == Finally) {
    if (this->handlerOffsetStack !=
        (SList<JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>,_Memory::ArenaAllocator,_RealCount>
         *)0x0) {
      bVar2 = SListBase<JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>,_Memory::ArenaAllocator,_RealCount>
              ::Empty(&this->handlerOffsetStack->
                       super_SListBase<JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>,_Memory::ArenaAllocator,_RealCount>
                     );
      if (bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar12 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                           ,0x1ba4,"(!this->handlerOffsetStack->Empty())",
                           "!this->handlerOffsetStack->Empty()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar12 = 0;
      }
      pTVar9 = SList<JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>,_Memory::ArenaAllocator,_RealCount>
               ::Top(this->handlerOffsetStack);
      pbVar10 = JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>::Second(pTVar9);
      if ((*pbVar10 & 1U) != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar12 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                           ,0x1ba5,"(this->handlerOffsetStack->Top().Second() == false)",
                           "this->handlerOffsetStack->Top().Second() == false");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar12 = 0;
      }
      SList<JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>,_Memory::ArenaAllocator,_RealCount>::
      Pop(this->handlerOffsetStack);
    }
    this->finallyBlockLevel = this->finallyBlockLevel + 1;
    pIVar5 = IR::Instr::New(Finally,this->m_func);
    AddInstr(this,pIVar5,offset);
    return;
  }
  if (newOpcode != BeginBodyScope) {
    AddInstr(this,pIVar5,offset);
    return;
  }
  bVar2 = IsParamScopeDone(this);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar12 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x1bbe,"(!this->IsParamScopeDone())","!this->IsParamScopeDone()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar12 = 0;
  }
  SetParamScopeDone(this,true);
  pSVar11 = Func::GetLocalClosureSym(this->m_func);
  if (pSVar11 != (StackSym *)0x0) {
    pSVar11 = Func::GetLocalClosureSym(this->m_func);
    lfd = (Instr *)IR::RegOpnd::New(pSVar11,TyVar,this->m_func);
    goto LAB_0063ce4a;
  }
  pJVar13 = Func::GetJITFunctionBody(this->m_func);
  uVar4 = JITTimeFunctionBody::GetScopeSlotArraySize(pJVar13);
  if (uVar4 == 0) {
    pJVar13 = Func::GetJITFunctionBody(this->m_func);
    bVar2 = JITTimeFunctionBody::HasScopeObject(pJVar13);
    if (bVar2) goto LAB_0063cdc1;
  }
  else {
LAB_0063cdc1:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar12 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x1bc8,
                       "(this->m_func->GetJITFunctionBody()->GetScopeSlotArraySize() == 0 && !this->m_func->GetJITFunctionBody()->HasScopeObject())"
                       ,
                       "this->m_func->GetJITFunctionBody()->GetScopeSlotArraySize() == 0 && !this->m_func->GetJITFunctionBody()->HasScopeObject()"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar12 = 0;
  }
  lfd = (Instr *)IR::IntConstOpnd::New(0,TyVar,this->m_func,false);
LAB_0063ce4a:
  pJVar13 = Func::GetJITFunctionBody(this->m_func);
  RVar3 = JITTimeFunctionBody::GetParamClosureReg(pJVar13);
  pRVar14 = BuildDstOpnd(this,RVar3,TyVar,false,false);
  pIVar5 = IR::Instr::New(Ld_A,&pRVar14->super_Opnd,(Opnd *)lfd,this->m_func);
  AddInstr(this,pIVar5,offset);
  pJVar13 = Func::GetJITFunctionBody(this->m_func);
  uVar4 = JITTimeFunctionBody::GetScopeSlotArraySize(pJVar13);
  if (uVar4 == 0) {
    pJVar13 = Func::GetJITFunctionBody(this->m_func);
    bVar2 = JITTimeFunctionBody::HasScopeObject(pJVar13);
    if (!bVar2) {
      return;
    }
  }
  pJVar13 = Func::GetJITFunctionBody(this->m_func);
  bVar2 = JITTimeFunctionBody::HasScopeObject(pJVar13);
  if (bVar2) {
    pJVar13 = Func::GetJITFunctionBody(this->m_func);
    bVar2 = JITTimeFunctionBody::HasCachedScopePropIds(pJVar13);
    if (bVar2) {
      BuildInitCachedScope(this,0,-1);
    }
    else {
      pJVar13 = Func::GetJITFunctionBody(this->m_func);
      RVar3 = JITTimeFunctionBody::GetLocalClosureReg(pJVar13);
      pRVar14 = BuildDstOpnd(this,RVar3,TyVar,false,false);
      pIVar5 = IR::Instr::New(NewScopeObject,&pRVar14->super_Opnd,this->m_func);
      AddInstr(this,pIVar5,0xffffffff);
    }
  }
  else {
    pJVar13 = Func::GetJITFunctionBody(this->m_func);
    RVar3 = JITTimeFunctionBody::GetLocalClosureReg(pJVar13);
    pRVar14 = BuildDstOpnd(this,RVar3,TyVar,false,false);
    pJVar13 = Func::GetJITFunctionBody(this->m_func);
    uVar4 = JITTimeFunctionBody::GetScopeSlotArraySize(pJVar13);
    src1Opnd_00 = IR::IntConstOpnd::New((ulong)(uVar4 + 2),TyUint32,this->m_func,false);
    pIVar5 = IR::Instr::New(NewScopeSlots,&pRVar14->super_Opnd,&src1Opnd_00->super_Opnd,this->m_func
                           );
    AddInstr(this,pIVar5,0xffffffff);
  }
  pJVar13 = Func::GetJITFunctionBody(this->m_func);
  RVar3 = JITTimeFunctionBody::GetLocalFrameDisplayReg(pJVar13);
  pRVar14 = BuildDstOpnd(this,RVar3,TyVar,false,false);
  pJVar13 = Func::GetJITFunctionBody(this->m_func);
  RVar3 = JITTimeFunctionBody::GetLocalClosureReg(pJVar13);
  pRVar15 = BuildDstOpnd(this,RVar3,TyVar,false,false);
  pJVar13 = Func::GetJITFunctionBody(this->m_func);
  RVar3 = JITTimeFunctionBody::GetLocalFrameDisplayReg(pJVar13);
  src2Opnd = BuildDstOpnd(this,RVar3,TyVar,false,false);
  pIVar5 = IR::Instr::New(LdFrameDisplay,&pRVar14->super_Opnd,&pRVar15->super_Opnd,
                          &src2Opnd->super_Opnd,this->m_func);
  AddInstr(this,pIVar5,0xffffffff);
  pIVar5->field_0x38 = pIVar5->field_0x38 & 0xfb | 4;
  return;
}

Assistant:

void
IRBuilder::BuildEmpty(Js::OpCode newOpcode, uint32 offset)
{
    IR::Instr *instr;

    m_jnReader.Empty();

    instr = IR::Instr::New(newOpcode, m_func);

    switch (newOpcode)
    {
    case Js::OpCode::CommitScope:
    {
        IR::RegOpnd *   src1Opnd;

        src1Opnd = this->BuildSrcOpnd(m_func->GetJITFunctionBody()->GetLocalClosureReg());

        IR::LabelInstr *labelNull = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);

        IR::RegOpnd * funcExprOpnd = IR::RegOpnd::New(TyVar, m_func);
        instr = IR::Instr::New(Js::OpCode::LdFuncExpr, funcExprOpnd, m_func);
        this->AddInstr(instr, offset);

        IR::BranchInstr *branchInstr = IR::BranchInstr::New(Js::OpCode::BrFncCachedScopeNeq, labelNull,
            funcExprOpnd, src1Opnd, this->m_func);
        this->AddInstr(branchInstr, offset);

        instr = IR::Instr::New(newOpcode, this->m_func);
        instr->SetSrc1(src1Opnd);

        this->AddInstr(instr, offset);

        this->AddInstr(labelNull, Js::Constants::NoByteCodeOffset);
        return;
    }
    case Js::OpCode::Ret:
    {
        IR::RegOpnd *regOpnd = BuildDstOpnd(0);
        instr->SetSrc1(regOpnd);
        this->AddInstr(instr, offset);
        break;
    }

    case Js::OpCode::Leave:
    {
        IR::BranchInstr * branchInstr;
        IR::LabelInstr * labelInstr;

        if (this->handlerOffsetStack && !this->handlerOffsetStack->Empty() && this->handlerOffsetStack->Top().Second())
        {
            // If the try region has a break block, we don't want the Flowgraph to move all of that code out of the loop
            // because an exception will bring the control back into the loop. The branch out of the loop (which is the
            // reason for the code to be a break block) can still be moved out though.
            //
            // "BrOnException $catch" is inserted before Leave's in the try region to instrument flow from the try region
            // to the catch region (which is in the loop).
            IR::BranchInstr * brOnException = IR::BranchInstr::New(Js::OpCode::BrOnException, nullptr, this->m_func);
            this->AddBranchInstr(brOnException, offset, this->handlerOffsetStack->Top().First());
        }

        labelInstr = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
        branchInstr = IR::BranchInstr::New(newOpcode, labelInstr, this->m_func);
        this->AddInstr(branchInstr, offset);
        this->AddInstr(labelInstr, Js::Constants::NoByteCodeOffset);
        break;
    }

    case Js::OpCode::LeaveNull:
        finallyBlockLevel--;
        this->AddInstr(instr, offset);
        break;

    case Js::OpCode::Finally:
        if (this->handlerOffsetStack)
        {
            AssertOrFailFast(!this->handlerOffsetStack->Empty());
            AssertOrFailFast(this->handlerOffsetStack->Top().Second() == false);
            this->handlerOffsetStack->Pop();
        }
        finallyBlockLevel++;
        this->AddInstr(IR::Instr::New(Js::OpCode::Finally, this->m_func), offset);
        break;

    case Js::OpCode::Break:
        if (m_func->IsJitInDebugMode())
        {
            // Add explicit bailout.
            this->InsertBailOutForDebugger(offset, IR::BailOutExplicit);
        }
        else
        {
            // Default behavior, let's keep it for now, removed in lowerer.
            this->AddInstr(instr, offset);
        }
        break;

    case Js::OpCode::BeginBodyScope:
    {
        // This marks the end of a param scope which is not merged with body scope.
        // So we have to first cache the closure so that we can use it to copy the initial values for
        // body syms from corresponding param syms (LdParamSlot). Body should get its own scope slot.
        Assert(!this->IsParamScopeDone());
        this->SetParamScopeDone();

        IR::Opnd * localClosureOpnd;
        if (this->m_func->GetLocalClosureSym() != nullptr)
        {
            localClosureOpnd = IR::RegOpnd::New(this->m_func->GetLocalClosureSym(), TyVar, this->m_func);
        }
        else
        {
            AssertOrFailFast(this->m_func->GetJITFunctionBody()->GetScopeSlotArraySize() == 0 && !this->m_func->GetJITFunctionBody()->HasScopeObject());
            localClosureOpnd = IR::IntConstOpnd::New(0, TyVar, this->m_func);
        }

        this->AddInstr(
            IR::Instr::New(
                Js::OpCode::Ld_A,
                this->BuildDstOpnd(this->m_func->GetJITFunctionBody()->GetParamClosureReg()),
                localClosureOpnd,
                this->m_func),
            offset);

        // Create a new local closure for the body when either body scope has scope slots allocated or
        // eval is present which can leak declarations.
        if (this->m_func->GetJITFunctionBody()->GetScopeSlotArraySize() > 0 || this->m_func->GetJITFunctionBody()->HasScopeObject())
        {
            if (this->m_func->GetJITFunctionBody()->HasScopeObject())
            {
                if (this->m_func->GetJITFunctionBody()->HasCachedScopePropIds())
                {
                    this->BuildInitCachedScope(0, Js::Constants::NoByteCodeOffset);
                }
                else
                {
                    this->AddInstr(
                        IR::Instr::New(
                            Js::OpCode::NewScopeObject,
                            this->BuildDstOpnd(this->m_func->GetJITFunctionBody()->GetLocalClosureReg()),
                            m_func),
                        Js::Constants::NoByteCodeOffset);
                }
            }
            else
            {
                this->AddInstr(
                    IR::Instr::New(
                        Js::OpCode::NewScopeSlots,
                        this->BuildDstOpnd(this->m_func->GetJITFunctionBody()->GetLocalClosureReg()),
                        IR::IntConstOpnd::New(this->m_func->GetJITFunctionBody()->GetScopeSlotArraySize() + Js::ScopeSlots::FirstSlotIndex, TyUint32, this->m_func),
                        m_func),
                    Js::Constants::NoByteCodeOffset);
            }

            IR::Instr* lfd = IR::Instr::New(
                Js::OpCode::LdFrameDisplay,
                this->BuildDstOpnd(this->m_func->GetJITFunctionBody()->GetLocalFrameDisplayReg()),
                this->BuildDstOpnd(this->m_func->GetJITFunctionBody()->GetLocalClosureReg()),
                this->BuildDstOpnd(this->m_func->GetJITFunctionBody()->GetLocalFrameDisplayReg()),
                this->m_func);
            this->AddInstr(
                lfd,
                Js::Constants::NoByteCodeOffset);
            lfd->isNonFastPathFrameDisplay = true;
        }
        break;
    }

    default:
        this->AddInstr(instr, offset);
        break;
    }
}